

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsysmp.cpp
# Opt level: O0

void __thiscall
TPZSYsmpMatrix<double>::TPZSYsmpMatrix(TPZSYsmpMatrix<double> *this,int64_t rows,int64_t cols)

{
  TPZPardisoSolver<double> *in_RSI;
  TPZRegisterClassId *in_RDI;
  int64_t in_stack_ffffffffffffffa8;
  int64_t in_stack_ffffffffffffffb0;
  TPZMatrix<double> *in_stack_ffffffffffffffc0;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZSYsmpMatrix<double>>(in_RDI,0x21);
  TPZMatrix<double>::TPZMatrix
            (in_stack_ffffffffffffffc0,(void **)in_RDI,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  *(undefined ***)in_RDI = &PTR__TPZSYsmpMatrix_02416b10;
  TPZVec<long>::TPZVec((TPZVec<long> *)(in_RDI + 0x20));
  TPZVec<long>::TPZVec((TPZVec<long> *)(in_RDI + 0x40));
  TPZVec<double>::TPZVec((TPZVec<double> *)(in_RDI + 0x60));
  TPZPardisoSolver<double>::TPZPardisoSolver(in_RSI);
  TPZVec<double>::TPZVec((TPZVec<double> *)(in_RDI + 0x3b8));
  return;
}

Assistant:

TPZSYsmpMatrix<TVar>::TPZSYsmpMatrix(const int64_t rows,const int64_t cols ) : TPZRegisterClassId(&TPZSYsmpMatrix::ClassId),
TPZMatrix<TVar>(rows,cols) {

#ifdef CONSTRUCTOR
	cerr << "TPZSYsmpMatrix(int rows,int cols)\n";
#endif
}